

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O0

uchar * __thiscall phosg::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  size_t sVar1;
  string *this_00;
  char *pcVar2;
  uchar *extraout_RAX;
  ulong local_68;
  size_t z;
  undefined1 local_50 [8];
  StringWriter w;
  size_t processed_offset;
  anon_class_8_1_8991fb9c process_block;
  size_t size_local;
  void *data_local;
  SHA1 *this_local;
  
  this->h[0] = 0x67452301;
  this->h[1] = 0xefcdab89;
  this->h[2] = 0x98badcfe;
  this->h[3] = 0x10325476;
  this->h[4] = 0xc3d2e1f0;
  processed_offset = (size_t)this;
  process_block.this = (SHA1 *)n;
  for (w.data.field_2._8_8_ = 0; (SHA1 *)(w.data.field_2._8_8_ + 0x3f) < process_block.this;
      w.data.field_2._8_8_ = w.data.field_2._8_8_ + 0x40) {
    SHA1::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&processed_offset,d + w.data.field_2._8_8_);
  }
  StringWriter::StringWriter((StringWriter *)local_50);
  StringWriter::write((StringWriter *)local_50,(int)d + (int)w.data.field_2._8_8_,
                      (void *)((long)process_block.this - w.data.field_2._8_8_),(size_t)md);
  StringWriter::put_u8((StringWriter *)local_50,0x80);
  sVar1 = StringWriter::size((StringWriter *)local_50);
  StringWriter::extend_to((StringWriter *)local_50,(ulong)(0x38 < sVar1) * 0x40 + 0x40,'\0');
  sVar1 = StringWriter::size((StringWriter *)local_50);
  StringWriter::pput_u64b((StringWriter *)local_50,sVar1 - 8,(long)process_block.this << 3);
  local_68 = 0;
  while( true ) {
    sVar1 = StringWriter::size((StringWriter *)local_50);
    if (sVar1 <= local_68) break;
    this_00 = StringWriter::str_abi_cxx11_((StringWriter *)local_50);
    pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (this_00);
    SHA1::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&processed_offset,pcVar2 + local_68);
    local_68 = local_68 + 0x40;
  }
  StringWriter::~StringWriter((StringWriter *)local_50);
  return extraout_RAX;
}

Assistant:

SHA1::SHA1(const void* data, size_t size) {
  this->h[0] = 0x67452301;
  this->h[1] = 0xEFCDAB89;
  this->h[2] = 0x98BADCFE;
  this->h[3] = 0x10325476;
  this->h[4] = 0xC3D2E1F0;

  auto process_block = [this](const void* block) -> void {
    uint32_t extended_fields[80];
    memcpy(extended_fields, block, 0x40);
#ifdef PHOSG_LITTLE_ENDIAN
    for (size_t x = 0; x < 16; x++) {
      extended_fields[x] = bswap32(extended_fields[x]);
    }
#endif

    for (size_t x = 16; x < 80; x++) {
      uint32_t z = extended_fields[x - 3] ^ extended_fields[x - 8] ^ extended_fields[x - 14] ^ extended_fields[x - 16];
      extended_fields[x] = (z << 1) | ((z >> 31) & 1);
    }

    uint32_t a = this->h[0], b = this->h[1], c = this->h[2], d = this->h[3], e = this->h[4];
    for (size_t x = 0; x < 80; x++) {
      uint32_t f, k;
      if (x < 20) {
        f = (b & c) | ((~b) & d);
        k = 0x5A827999;
      } else if (x < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (x < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }

      uint32_t new_a = ((a << 5) | ((a >> 27) & 0x1F)) + f + e + k + extended_fields[x];
      e = d;
      d = c;
      c = (b << 30) | ((b >> 2) & 0x3FFFFFFF);
      b = a;
      a = new_a;
    }

    this->h[0] += a;
    this->h[1] += b;
    this->h[2] += c;
    this->h[3] += d;
    this->h[4] += e;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64b(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}